

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void UIEngine(shared_ptr<ApplicationContextBase> *context)

{
  element_type *peVar1;
  ApplicationContextBase *context_00;
  __shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  
  while( true ) {
    peVar1 = std::
             __shared_ptr_access<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1160b8);
    if (((peVar1->join_now ^ 0xffU) & 1) == 0) break;
    glfwWaitEventsTimeout(5.62689387786012e-318);
    std::__shared_ptr_access<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1160da);
    context_00 = (ApplicationContextBase *)
                 std::__shared_ptr_access<UIContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<UIContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1160e6);
    std::__shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI);
    UIContext::Render((UIContext *)in_RDI,context_00);
    peVar1 = std::
             __shared_ptr_access<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11610a);
    (*peVar1->_vptr_ApplicationContextBase[3])();
  }
  return;
}

Assistant:

void UIEngine(std::shared_ptr<ApplicationContextBase> context)
{
    while (!context->join_now)
    {
        // if the graphics viewport is not actively rendering, update at 24hz
        // When the render engine is in place, and has an animation mode,
        // this timeout should be set appropriately to the intended frame rate.
        // We'll come back to this later.
        glfwWaitEventsTimeout(1.f / 24.f);
        context->ui->Render(*context.get());
        context->Update();
    }
}